

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

float ncnn::reduction(float v0,float *ptr,int size0,int stride0,int size1,int stride1,int op_type)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  float fVar4;
  float sum;
  
  switch(op_type) {
  case 0:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            v0 = v0 + *pfVar2;
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  case 1:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            v0 = v0 + ABS(*pfVar2);
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  case 2:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            v0 = v0 + *pfVar2 * *pfVar2;
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  case 3:
  case 7:
  case 8:
  case 9:
    break;
  case 4:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            if (v0 <= *pfVar2) {
              v0 = *pfVar2;
            }
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  case 5:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            if (*pfVar2 <= v0) {
              v0 = *pfVar2;
            }
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  case 6:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            v0 = v0 * *pfVar2;
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  case 10:
    if (0 < size1) {
      iVar3 = 0;
      do {
        pfVar2 = ptr;
        iVar1 = size0;
        if (0 < size0) {
          do {
            fVar4 = expf(*pfVar2);
            v0 = v0 + fVar4;
            pfVar2 = pfVar2 + stride0;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        iVar3 = iVar3 + 1;
        ptr = ptr + stride1;
      } while (iVar3 != size1);
    }
    break;
  default:
    goto switchD_00344439_default;
  }
switchD_00344439_default:
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int stride0, int size1, int stride1, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size0, stride0, size1, stride1);

    // should never reach here
    return v0;
}